

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O1

void __thiscall
RasterizerA3<32u>::_renderImpl<CompositorSIMD,false>(RasterizerA3<32u> *this,uint32_t argb32)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  ulong *puVar35;
  undefined1 auVar36 [16];
  short sVar37;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  undefined1 in_XMM1 [16];
  undefined1 auVar38 [16];
  short sVar45;
  undefined1 in_XMM2 [16];
  undefined1 auVar46 [16];
  short sVar47;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  undefined1 in_XMM3 [16];
  undefined1 auVar48 [16];
  short sVar55;
  short sVar56;
  short sVar58;
  short sVar59;
  undefined4 uVar60;
  ushort uVar75;
  ushort uVar78;
  short sVar80;
  int iVar82;
  short sVar85;
  undefined1 in_XMM6 [16];
  short sVar73;
  int iVar87;
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  short sVar74;
  short sVar77;
  short sVar79;
  short sVar83;
  short sVar88;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  short sVar81;
  short sVar84;
  short sVar86;
  short sVar89;
  undefined1 auVar72 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar90 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  short sVar98;
  int iVar101;
  undefined1 in_XMM13 [16];
  int iVar102;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  short sVar57;
  undefined1 auVar61 [12];
  undefined1 auVar64 [16];
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  short sVar76;
  
  auVar16 = _DAT_00112190;
  auVar15 = _DAT_00112160;
  uVar32 = (ulong)(int)*(uint *)(this + 0x40);
  uVar3 = *(uint *)(this + 0x44);
  if (*(uint *)(this + 0x40) <= uVar3) {
    lVar4 = *(long *)(*(long *)(this + 8) + 8);
    iVar26 = (argb32 & 0xff00ff) * (argb32 >> 0x18);
    iVar22 = (argb32 >> 8 & 0xff | 0xff0000) * (argb32 >> 0x18);
    uVar29 = (iVar26 + 0x800080U >> 8 & 0xff00ff) + iVar26 + 0x800080 >> 8 & 0xff00ff |
             iVar22 + (iVar22 + 0x800080U >> 8 & 0xff00ff) + 0x800080 & 0xff00ff00;
    auVar36._4_4_ = uVar29;
    auVar36._0_4_ = uVar29;
    auVar36._8_4_ = uVar29;
    auVar36._12_4_ = uVar29;
    lVar30 = lVar4 * uVar32 + *(long *)(*(long *)(this + 8) + 0x10);
    lVar25 = *(long *)(this + 0x58) * uVar32 * 8 + *(long *)(this + 0x60);
    auVar38 = pmovzxbw(in_XMM1,auVar36);
    puVar35 = (ulong *)(*(long *)(this + 0x48) * uVar32 * 8 + *(long *)(this + 0x50));
    auVar46 = pmovzxbw(in_XMM2,0xffffffffffffffff);
    auVar48 = pmovzxbw(in_XMM3,0x8080808080808080);
    auVar90 = pmovsxwd(in_XMM8,0x1ff01ff01ff01ff);
    do {
      lVar21 = *(long *)(this + 0x48);
      uVar28 = 0;
      uVar17 = 0;
      uVar31 = 0;
      do {
        uVar20 = *puVar35;
        *puVar35 = 0;
        sVar47 = auVar48._0_2_;
        sVar49 = auVar48._2_2_;
        sVar50 = auVar48._4_2_;
        sVar51 = auVar48._6_2_;
        sVar52 = auVar48._8_2_;
        sVar53 = auVar48._10_2_;
        sVar54 = auVar48._12_2_;
        sVar55 = auVar48._14_2_;
        sVar37 = auVar38._0_2_;
        sVar39 = auVar38._2_2_;
        sVar40 = auVar38._4_2_;
        sVar41 = auVar38._6_2_;
        sVar42 = auVar38._8_2_;
        sVar43 = auVar38._10_2_;
        sVar44 = auVar38._12_2_;
        sVar45 = auVar38._14_2_;
        if (uVar20 != 0) {
          do {
            lVar5 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            uVar27 = -1L << ((byte)lVar5 & 0x3f);
            uVar23 = (uint)((int)lVar5 << 5) | uVar31;
            uVar33 = uVar23 - uVar17;
            uVar24 = uVar17;
            if (uVar17 <= uVar23 && uVar33 != 0) {
              uVar18 = uVar28 & 0x1ff;
              uVar34 = uVar18 ^ 0x1ff;
              if (uVar18 < 0x100) {
                uVar34 = uVar18;
              }
              uVar24 = uVar23;
              if (uVar34 != 0) {
                uVar19 = uVar33 >> 2;
                if (uVar34 == 0xff) {
                  if (0x1f < uVar33) {
                    do {
                      *(undefined1 (*) [16])(lVar30 + uVar17 * 4) = auVar36;
                      *(undefined1 (*) [16])(lVar30 + 0x10 + uVar17 * 4) = auVar36;
                      *(undefined1 (*) [16])(lVar30 + 0x20 + uVar17 * 4) = auVar36;
                      *(undefined1 (*) [16])(lVar30 + 0x30 + uVar17 * 4) = auVar36;
                      *(undefined1 (*) [16])(lVar30 + 0x40 + uVar17 * 4) = auVar36;
                      *(undefined1 (*) [16])(lVar30 + 0x50 + uVar17 * 4) = auVar36;
                      *(undefined1 (*) [16])(lVar30 + 0x60 + uVar17 * 4) = auVar36;
                      *(undefined1 (*) [16])(lVar30 + 0x70 + uVar17 * 4) = auVar36;
                      uVar17 = uVar17 + 0x20;
                      uVar19 = uVar19 - 8;
                    } while (7 < uVar19);
                  }
                  for (; uVar19 != 0; uVar19 = uVar19 - 1) {
                    *(undefined1 (*) [16])(lVar30 + uVar17 * 4) = auVar36;
                    uVar17 = uVar17 + 4;
                  }
                  for (; uVar17 < uVar23; uVar17 = uVar17 + 1) {
                    *(uint *)(lVar30 + uVar17 * 4) = uVar29;
                  }
                }
                else {
                  auVar104 = pshuflw(ZEXT416(uVar34),ZEXT416(uVar34),0);
                  auVar91._0_4_ = auVar104._0_4_;
                  auVar91._4_4_ = auVar91._0_4_;
                  auVar91._8_4_ = auVar91._0_4_;
                  auVar91._12_4_ = auVar91._0_4_;
                  sVar86 = auVar104._0_2_;
                  sVar89 = auVar104._2_2_;
                  auVar91 = auVar91 ^ auVar46;
                  in_XMM13._0_2_ = sVar86 * sVar37 + sVar47;
                  in_XMM13._2_2_ = sVar89 * sVar39 + sVar49;
                  in_XMM13._4_2_ = sVar86 * sVar40 + sVar50;
                  in_XMM13._6_2_ = sVar89 * sVar41 + sVar51;
                  in_XMM13._8_2_ = sVar86 * sVar42 + sVar52;
                  in_XMM13._10_2_ = sVar89 * sVar43 + sVar53;
                  in_XMM13._12_2_ = sVar86 * sVar44 + sVar54;
                  in_XMM13._14_2_ = sVar89 * sVar45 + sVar55;
                  sVar98 = auVar91._0_2_;
                  sVar57 = auVar91._2_2_;
                  sVar59 = auVar91._4_2_;
                  sVar56 = auVar91._6_2_;
                  sVar73 = auVar91._8_2_;
                  sVar76 = auVar91._10_2_;
                  sVar81 = auVar91._12_2_;
                  sVar84 = auVar91._14_2_;
                  if (7 < uVar33) {
                    do {
                      auVar104 = *(undefined1 (*) [16])(lVar30 + uVar17 * 4);
                      auVar91 = *(undefined1 (*) [16])(lVar30 + 0x10 + uVar17 * 4);
                      auVar108 = pmovzxbw(in_XMM15,auVar104);
                      auVar110 = pmovzxbw(in_XMM9,auVar91);
                      auVar100._0_2_ = (ushort)auVar104[8] * sVar98 + in_XMM13._0_2_;
                      auVar100._2_2_ = (ushort)auVar104[9] * sVar57 + in_XMM13._2_2_;
                      auVar100._4_2_ = (ushort)auVar104[10] * sVar59 + in_XMM13._4_2_;
                      auVar100._6_2_ = (ushort)auVar104[0xb] * sVar56 + in_XMM13._6_2_;
                      auVar100._8_2_ = (ushort)auVar104[0xc] * sVar73 + in_XMM13._8_2_;
                      auVar100._10_2_ = (ushort)auVar104[0xd] * sVar76 + in_XMM13._10_2_;
                      auVar100._12_2_ = (ushort)auVar104[0xe] * sVar81 + in_XMM13._12_2_;
                      auVar100._14_2_ = (ushort)auVar104[0xf] * sVar84 + in_XMM13._14_2_;
                      in_XMM6 = pmulhuw(auVar100,auVar15);
                      auVar105._0_2_ = (ushort)auVar91[8] * sVar98 + in_XMM13._0_2_;
                      auVar105._2_2_ = (ushort)auVar91[9] * sVar57 + in_XMM13._2_2_;
                      auVar105._4_2_ = (ushort)auVar91[10] * sVar59 + in_XMM13._4_2_;
                      auVar105._6_2_ = (ushort)auVar91[0xb] * sVar56 + in_XMM13._6_2_;
                      auVar105._8_2_ = (ushort)auVar91[0xc] * sVar73 + in_XMM13._8_2_;
                      auVar105._10_2_ = (ushort)auVar91[0xd] * sVar76 + in_XMM13._10_2_;
                      auVar105._12_2_ = (ushort)auVar91[0xe] * sVar81 + in_XMM13._12_2_;
                      auVar105._14_2_ = (ushort)auVar91[0xf] * sVar84 + in_XMM13._14_2_;
                      in_XMM14 = pmulhuw(auVar105,auVar15);
                      auVar109._0_2_ = auVar108._0_2_ * sVar98 + in_XMM13._0_2_;
                      auVar109._2_2_ = auVar108._2_2_ * sVar57 + in_XMM13._2_2_;
                      auVar109._4_2_ = auVar108._4_2_ * sVar59 + in_XMM13._4_2_;
                      auVar109._6_2_ = auVar108._6_2_ * sVar56 + in_XMM13._6_2_;
                      auVar109._8_2_ = auVar108._8_2_ * sVar73 + in_XMM13._8_2_;
                      auVar109._10_2_ = auVar108._10_2_ * sVar76 + in_XMM13._10_2_;
                      auVar109._12_2_ = auVar108._12_2_ * sVar81 + in_XMM13._12_2_;
                      auVar109._14_2_ = auVar108._14_2_ * sVar84 + in_XMM13._14_2_;
                      auVar104 = pmulhuw(auVar109,auVar15);
                      sVar58 = auVar104._0_2_;
                      sVar74 = auVar104._2_2_;
                      in_XMM15[1] = (0 < sVar74) * (sVar74 < 0x100) * auVar104[2] - (0xff < sVar74);
                      in_XMM15[0] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[0] - (0xff < sVar58);
                      sVar58 = auVar104._4_2_;
                      in_XMM15[2] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[4] - (0xff < sVar58);
                      sVar58 = auVar104._6_2_;
                      in_XMM15[3] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[6] - (0xff < sVar58);
                      sVar58 = auVar104._8_2_;
                      in_XMM15[4] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[8] - (0xff < sVar58);
                      sVar58 = auVar104._10_2_;
                      in_XMM15[5] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[10] - (0xff < sVar58)
                      ;
                      sVar58 = auVar104._12_2_;
                      in_XMM15[6] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[0xc] -
                                    (0xff < sVar58);
                      sVar58 = auVar104._14_2_;
                      in_XMM15[7] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[0xe] -
                                    (0xff < sVar58);
                      sVar58 = in_XMM6._0_2_;
                      in_XMM15[8] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM6[0] - (0xff < sVar58);
                      sVar58 = in_XMM6._2_2_;
                      in_XMM15[9] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM6[2] - (0xff < sVar58);
                      sVar58 = in_XMM6._4_2_;
                      in_XMM15[10] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM6[4] - (0xff < sVar58);
                      sVar58 = in_XMM6._6_2_;
                      in_XMM15[0xb] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM6[6] - (0xff < sVar58)
                      ;
                      sVar58 = in_XMM6._8_2_;
                      in_XMM15[0xc] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM6[8] - (0xff < sVar58)
                      ;
                      sVar58 = in_XMM6._10_2_;
                      in_XMM15[0xd] =
                           (0 < sVar58) * (sVar58 < 0x100) * in_XMM6[10] - (0xff < sVar58);
                      sVar58 = in_XMM6._12_2_;
                      in_XMM15[0xe] =
                           (0 < sVar58) * (sVar58 < 0x100) * in_XMM6[0xc] - (0xff < sVar58);
                      sVar58 = in_XMM6._14_2_;
                      in_XMM15[0xf] =
                           (0 < sVar58) * (sVar58 < 0x100) * in_XMM6[0xe] - (0xff < sVar58);
                      auVar104._0_2_ = auVar110._0_2_ * sVar98 + in_XMM13._0_2_;
                      auVar104._2_2_ = auVar110._2_2_ * sVar57 + in_XMM13._2_2_;
                      auVar104._4_2_ = auVar110._4_2_ * sVar59 + in_XMM13._4_2_;
                      auVar104._6_2_ = auVar110._6_2_ * sVar56 + in_XMM13._6_2_;
                      auVar104._8_2_ = auVar110._8_2_ * sVar73 + in_XMM13._8_2_;
                      auVar104._10_2_ = auVar110._10_2_ * sVar76 + in_XMM13._10_2_;
                      auVar104._12_2_ = auVar110._12_2_ * sVar81 + in_XMM13._12_2_;
                      auVar104._14_2_ = auVar110._14_2_ * sVar84 + in_XMM13._14_2_;
                      auVar104 = pmulhuw(auVar104,auVar15);
                      sVar58 = auVar104._0_2_;
                      sVar74 = auVar104._2_2_;
                      in_XMM9[1] = (0 < sVar74) * (sVar74 < 0x100) * auVar104[2] - (0xff < sVar74);
                      in_XMM9[0] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[0] - (0xff < sVar58);
                      sVar58 = auVar104._4_2_;
                      in_XMM9[2] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[4] - (0xff < sVar58);
                      sVar58 = auVar104._6_2_;
                      in_XMM9[3] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[6] - (0xff < sVar58);
                      sVar58 = auVar104._8_2_;
                      in_XMM9[4] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[8] - (0xff < sVar58);
                      sVar58 = auVar104._10_2_;
                      in_XMM9[5] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[10] - (0xff < sVar58);
                      sVar58 = auVar104._12_2_;
                      in_XMM9[6] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[0xc] - (0xff < sVar58)
                      ;
                      sVar58 = auVar104._14_2_;
                      in_XMM9[7] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[0xe] - (0xff < sVar58)
                      ;
                      sVar58 = in_XMM14._0_2_;
                      in_XMM9[8] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM14[0] - (0xff < sVar58);
                      sVar58 = in_XMM14._2_2_;
                      in_XMM9[9] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM14[2] - (0xff < sVar58);
                      sVar58 = in_XMM14._4_2_;
                      in_XMM9[10] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM14[4] - (0xff < sVar58);
                      sVar58 = in_XMM14._6_2_;
                      in_XMM9[0xb] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM14[6] - (0xff < sVar58)
                      ;
                      sVar58 = in_XMM14._8_2_;
                      in_XMM9[0xc] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM14[8] - (0xff < sVar58)
                      ;
                      sVar58 = in_XMM14._10_2_;
                      in_XMM9[0xd] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM14[10] -
                                     (0xff < sVar58);
                      sVar58 = in_XMM14._12_2_;
                      in_XMM9[0xe] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM14[0xc] -
                                     (0xff < sVar58);
                      sVar58 = in_XMM14._14_2_;
                      in_XMM9[0xf] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM14[0xe] -
                                     (0xff < sVar58);
                      *(undefined1 (*) [16])(lVar30 + uVar17 * 4) = in_XMM15;
                      *(undefined1 (*) [16])(lVar30 + 0x10 + uVar17 * 4) = in_XMM9;
                      uVar17 = uVar17 + 8;
                      uVar19 = uVar19 - 2;
                    } while (1 < uVar19);
                  }
                  if (uVar19 != 0) {
                    auVar104 = *(undefined1 (*) [16])(lVar30 + uVar17 * 4);
                    auVar91 = pmovzxbw(in_XMM9,auVar104);
                    auVar110._0_2_ = (ushort)auVar104[8] * sVar98 + in_XMM13._0_2_;
                    auVar110._2_2_ = (ushort)auVar104[9] * sVar57 + in_XMM13._2_2_;
                    auVar110._4_2_ = (ushort)auVar104[10] * sVar59 + in_XMM13._4_2_;
                    auVar110._6_2_ = (ushort)auVar104[0xb] * sVar56 + in_XMM13._6_2_;
                    auVar110._8_2_ = (ushort)auVar104[0xc] * sVar73 + in_XMM13._8_2_;
                    auVar110._10_2_ = (ushort)auVar104[0xd] * sVar76 + in_XMM13._10_2_;
                    auVar110._12_2_ = (ushort)auVar104[0xe] * sVar81 + in_XMM13._12_2_;
                    auVar110._14_2_ = (ushort)auVar104[0xf] * sVar84 + in_XMM13._14_2_;
                    in_XMM6 = pmulhuw(auVar110,auVar15);
                    auVar108._0_2_ = auVar91._0_2_ * sVar98 + in_XMM13._0_2_;
                    auVar108._2_2_ = auVar91._2_2_ * sVar57 + in_XMM13._2_2_;
                    auVar108._4_2_ = auVar91._4_2_ * sVar59 + in_XMM13._4_2_;
                    auVar108._6_2_ = auVar91._6_2_ * sVar56 + in_XMM13._6_2_;
                    auVar108._8_2_ = auVar91._8_2_ * sVar73 + in_XMM13._8_2_;
                    auVar108._10_2_ = auVar91._10_2_ * sVar76 + in_XMM13._10_2_;
                    auVar108._12_2_ = auVar91._12_2_ * sVar81 + in_XMM13._12_2_;
                    auVar108._14_2_ = auVar91._14_2_ * sVar84 + in_XMM13._14_2_;
                    auVar104 = pmulhuw(auVar108,auVar15);
                    sVar58 = auVar104._0_2_;
                    sVar74 = auVar104._2_2_;
                    in_XMM9[1] = (0 < sVar74) * (sVar74 < 0x100) * auVar104[2] - (0xff < sVar74);
                    in_XMM9[0] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[0] - (0xff < sVar58);
                    sVar58 = auVar104._4_2_;
                    in_XMM9[2] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[4] - (0xff < sVar58);
                    sVar58 = auVar104._6_2_;
                    in_XMM9[3] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[6] - (0xff < sVar58);
                    sVar58 = auVar104._8_2_;
                    in_XMM9[4] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[8] - (0xff < sVar58);
                    sVar58 = auVar104._10_2_;
                    in_XMM9[5] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[10] - (0xff < sVar58);
                    sVar58 = auVar104._12_2_;
                    in_XMM9[6] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[0xc] - (0xff < sVar58);
                    sVar58 = auVar104._14_2_;
                    in_XMM9[7] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[0xe] - (0xff < sVar58);
                    sVar58 = in_XMM6._0_2_;
                    in_XMM9[8] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM6[0] - (0xff < sVar58);
                    sVar58 = in_XMM6._2_2_;
                    in_XMM9[9] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM6[2] - (0xff < sVar58);
                    sVar58 = in_XMM6._4_2_;
                    in_XMM9[10] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM6[4] - (0xff < sVar58);
                    sVar58 = in_XMM6._6_2_;
                    in_XMM9[0xb] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM6[6] - (0xff < sVar58);
                    sVar58 = in_XMM6._8_2_;
                    in_XMM9[0xc] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM6[8] - (0xff < sVar58);
                    sVar58 = in_XMM6._10_2_;
                    in_XMM9[0xd] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM6[10] - (0xff < sVar58);
                    sVar58 = in_XMM6._12_2_;
                    in_XMM9[0xe] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM6[0xc] - (0xff < sVar58);
                    sVar58 = in_XMM6._14_2_;
                    in_XMM9[0xf] = (0 < sVar58) * (sVar58 < 0x100) * in_XMM6[0xe] - (0xff < sVar58);
                    *(undefined1 (*) [16])(lVar30 + uVar17 * 4) = in_XMM9;
                    uVar17 = uVar17 + 4;
                  }
                  in_XMM6 = pmovzxbw(in_XMM6,0x8080808080808080);
                  if (uVar17 < uVar23) {
                    sVar58 = in_XMM6._0_2_;
                    sVar74 = in_XMM6._2_2_;
                    sVar77 = in_XMM6._4_2_;
                    sVar79 = in_XMM6._6_2_;
                    sVar80 = in_XMM6._8_2_;
                    sVar83 = in_XMM6._10_2_;
                    sVar85 = in_XMM6._12_2_;
                    sVar88 = in_XMM6._14_2_;
                    do {
                      auVar104 = ZEXT416(*(uint *)(lVar30 + uVar17 * 4));
                      auVar104 = pmovzxbw(auVar104,auVar104);
                      auVar69._0_2_ = auVar104._0_2_ * sVar98 + sVar86 * sVar37 + sVar58;
                      auVar69._2_2_ = auVar104._2_2_ * sVar57 + sVar89 * sVar39 + sVar74;
                      auVar69._4_2_ = auVar104._4_2_ * sVar59 + sVar86 * sVar40 + sVar77;
                      auVar69._6_2_ = auVar104._6_2_ * sVar56 + sVar89 * sVar41 + sVar79;
                      auVar69._8_2_ = auVar104._8_2_ * sVar73 + sVar86 * sVar42 + sVar80;
                      auVar69._10_2_ = auVar104._10_2_ * sVar76 + sVar89 * sVar43 + sVar83;
                      auVar69._12_2_ = auVar104._12_2_ * sVar81 + sVar86 * sVar44 + sVar85;
                      auVar69._14_2_ = auVar104._14_2_ * sVar84 + sVar89 * sVar45 + sVar88;
                      auVar104 = pmulhuw(auVar69,auVar16);
                      sVar6 = auVar104._0_2_;
                      sVar7 = auVar104._2_2_;
                      sVar8 = auVar104._4_2_;
                      sVar9 = auVar104._6_2_;
                      in_XMM6._0_4_ =
                           CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar104[6] - (0xff < sVar9),
                                    CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar104[4] -
                                             (0xff < sVar8),
                                             CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar104[2] -
                                                      (0xff < sVar7),
                                                      (0 < sVar6) * (sVar6 < 0x100) * auVar104[0] -
                                                      (0xff < sVar6))));
                      sVar10 = auVar104._8_2_;
                      in_XMM6[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar104[8] - (0xff < sVar10);
                      sVar11 = auVar104._10_2_;
                      in_XMM6[5] = (0 < sVar11) * (sVar11 < 0x100) * auVar104[10] - (0xff < sVar11);
                      sVar12 = auVar104._12_2_;
                      in_XMM6[6] = (0 < sVar12) * (sVar12 < 0x100) * auVar104[0xc] - (0xff < sVar12)
                      ;
                      sVar13 = auVar104._14_2_;
                      in_XMM6[7] = (0 < sVar13) * (sVar13 < 0x100) * auVar104[0xe] - (0xff < sVar13)
                      ;
                      in_XMM6[8] = (0 < sVar6) * (sVar6 < 0x100) * auVar104[0] - (0xff < sVar6);
                      in_XMM6[9] = (0 < sVar7) * (sVar7 < 0x100) * auVar104[2] - (0xff < sVar7);
                      in_XMM6[10] = (0 < sVar8) * (sVar8 < 0x100) * auVar104[4] - (0xff < sVar8);
                      in_XMM6[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar104[6] - (0xff < sVar9);
                      in_XMM6[0xc] = (0 < sVar10) * (sVar10 < 0x100) * auVar104[8] - (0xff < sVar10)
                      ;
                      in_XMM6[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar104[10] -
                                     (0xff < sVar11);
                      in_XMM6[0xe] = (0 < sVar12) * (sVar12 < 0x100) * auVar104[0xc] -
                                     (0xff < sVar12);
                      in_XMM6[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar104[0xe] -
                                     (0xff < sVar13);
                      *(undefined4 *)(lVar30 + uVar17 * 4) = in_XMM6._0_4_;
                      uVar17 = uVar17 + 1;
                    } while (uVar17 < uVar23);
                  }
                }
              }
            }
            uVar23 = uVar27 ^ uVar20;
            if (uVar20 == uVar27) {
              uVar17 = (long)*(int *)(this + 0x30);
              if (uVar31 + 0x800 < (ulong)(long)*(int *)(this + 0x30)) {
                uVar17 = uVar31 + 0x800;
              }
            }
            else {
              lVar5 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                }
              }
              uVar23 = -1L << ((byte)lVar5 & 0x3f) ^ uVar23;
              uVar17 = (uint)((int)lVar5 << 5) | uVar31;
            }
            auVar96 = ZEXT416(uVar28);
            if (3 < uVar17 - uVar24) {
              auVar96._4_4_ = uVar28;
              auVar96._0_4_ = uVar28;
              auVar96._8_4_ = uVar28;
              auVar96._12_4_ = uVar28;
              uVar20 = uVar17 - uVar24 >> 2;
              do {
                piVar1 = (int *)(lVar25 + uVar24 * 8);
                iVar22 = *piVar1;
                piVar2 = (int *)(lVar25 + 0x10 + uVar24 * 8);
                iVar101 = iVar22 + piVar1[2];
                auVar14._4_4_ = iVar101;
                auVar14._0_4_ = iVar22;
                auVar14._8_8_ = 0;
                iVar26 = auVar96._0_4_;
                iVar82 = auVar96._4_4_;
                iVar87 = auVar96._8_4_;
                iVar102 = *piVar2 + piVar2[2] + auVar96._12_4_ + iVar101;
                auVar96._4_4_ = iVar102;
                auVar96._0_4_ = iVar102;
                auVar96._8_4_ = iVar102;
                auVar96._12_4_ = iVar102;
                auVar99._0_4_ = (iVar22 + iVar26) - ((uint)piVar1[1] >> 9);
                auVar99._4_4_ = (iVar101 + iVar82) - ((uint)piVar1[3] >> 9);
                auVar99._8_4_ = (piVar1[2] + *piVar2 + iVar87 + iVar22) - ((uint)piVar2[1] >> 9);
                auVar99._12_4_ = iVar102 - ((uint)piVar2[3] >> 9);
                auVar100 = packusdw(auVar99 & auVar90,auVar99 & auVar90);
                iVar22 = 0x1ff01ff - auVar100._0_4_;
                iVar26 = 0x1ff01ff - auVar100._4_4_;
                iVar82 = 0x1ff01ff - auVar100._8_4_;
                iVar87 = 0x1ff01ff - auVar100._12_4_;
                sVar98 = auVar100._0_2_;
                sVar56 = (short)iVar22;
                sVar57 = auVar100._2_2_;
                sVar73 = (short)((uint)iVar22 >> 0x10);
                sVar59 = auVar100._4_2_;
                sVar76 = (short)iVar26;
                uVar75 = (ushort)(sVar59 < sVar76) * sVar59 | (ushort)(sVar59 >= sVar76) * sVar76;
                sVar59 = auVar100._6_2_;
                sVar76 = (short)((uint)iVar26 >> 0x10);
                uVar78 = (ushort)(sVar59 < sVar76) * sVar59 | (ushort)(sVar59 >= sVar76) * sVar76;
                auVar63._0_8_ =
                     CONCAT26(uVar78,CONCAT24(uVar75,CONCAT22((ushort)(sVar57 < sVar73) * sVar57 |
                                                              (ushort)(sVar57 >= sVar73) * sVar73,
                                                              (ushort)(sVar98 < sVar56) * sVar98 |
                                                              (ushort)(sVar98 >= sVar56) * sVar56)))
                ;
                sVar98 = auVar100._8_2_;
                sVar57 = (short)iVar82;
                auVar61._0_10_ =
                     CONCAT28((ushort)(sVar98 < sVar57) * sVar98 |
                              (ushort)(sVar98 >= sVar57) * sVar57,auVar63._0_8_);
                sVar98 = auVar100._10_2_;
                sVar57 = (short)((uint)iVar82 >> 0x10);
                auVar61._10_2_ =
                     (ushort)(sVar98 < sVar57) * sVar98 | (ushort)(sVar98 >= sVar57) * sVar57;
                sVar98 = auVar100._12_2_;
                sVar57 = (short)iVar87;
                sVar59 = (short)((uint)iVar87 >> 0x10);
                auVar62._12_2_ =
                     (ushort)(sVar98 < sVar57) * sVar98 | (ushort)(sVar98 >= sVar57) * sVar57;
                auVar62._0_12_ = auVar61;
                sVar98 = auVar100._14_2_;
                auVar62._14_2_ =
                     (ushort)(sVar98 < sVar59) * sVar98 | (ushort)(sVar98 >= sVar59) * sVar59;
                auVar91 = pshuflw(auVar14 << 0x40,auVar62,0x50);
                auVar65._12_2_ = uVar78;
                auVar65._0_12_ = auVar61;
                auVar65._14_2_ = uVar78;
                auVar64._12_4_ = auVar65._12_4_;
                auVar64._10_2_ = uVar75;
                auVar64._0_10_ = auVar61._0_10_;
                auVar63._10_6_ = auVar64._10_6_;
                auVar63._8_2_ = uVar75;
                *(undefined1 (*) [16])(lVar25 + uVar24 * 8) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(lVar25 + 0x10 + uVar24 * 8) = (undefined1  [16])0x0;
                auVar104 = *(undefined1 (*) [16])(lVar30 + uVar24 * 4);
                in_XMM13 = pmovzxbw(auVar100,auVar104);
                auVar92._0_4_ = auVar91._0_4_;
                auVar92._4_4_ = auVar92._0_4_;
                auVar92._8_4_ = auVar91._4_4_;
                auVar92._12_4_ = auVar91._4_4_;
                auVar66._4_4_ = auVar63._8_4_;
                auVar66._0_4_ = auVar63._8_4_;
                auVar66._8_4_ = auVar64._12_4_;
                auVar66._12_4_ = auVar64._12_4_;
                auVar92 = auVar92 ^ auVar46;
                in_XMM9._0_2_ = auVar92._0_2_ * in_XMM13._0_2_;
                in_XMM9._2_2_ = auVar92._2_2_ * in_XMM13._2_2_;
                in_XMM9._4_2_ = auVar92._4_2_ * in_XMM13._4_2_;
                in_XMM9._6_2_ = auVar92._6_2_ * in_XMM13._6_2_;
                in_XMM9._8_2_ = auVar92._8_2_ * in_XMM13._8_2_;
                in_XMM9._10_2_ = auVar92._10_2_ * in_XMM13._10_2_;
                in_XMM9._12_2_ = auVar92._12_2_ * in_XMM13._12_2_;
                in_XMM9._14_2_ = auVar92._14_2_ * in_XMM13._14_2_;
                auVar66 = auVar66 ^ auVar46;
                in_XMM6._0_2_ = auVar66._0_2_ * (ushort)auVar104[8];
                in_XMM6._2_2_ = auVar66._2_2_ * (ushort)auVar104[9];
                in_XMM6._4_2_ = auVar66._4_2_ * (ushort)auVar104[10];
                in_XMM6._6_2_ = auVar66._6_2_ * (ushort)auVar104[0xb];
                in_XMM6._8_2_ = auVar66._8_2_ * (ushort)auVar104[0xc];
                in_XMM6._10_2_ = auVar66._10_2_ * (ushort)auVar104[0xd];
                in_XMM6._12_2_ = auVar66._12_2_ * (ushort)auVar104[0xe];
                in_XMM6._14_2_ = auVar66._14_2_ * (ushort)auVar104[0xf];
                auVar103._0_2_ = auVar91._0_2_ * sVar37 + sVar47 + in_XMM9._0_2_;
                auVar103._2_2_ = auVar91._2_2_ * sVar39 + sVar49 + in_XMM9._2_2_;
                auVar103._4_2_ = auVar91._0_2_ * sVar40 + sVar50 + in_XMM9._4_2_;
                auVar103._6_2_ = auVar91._2_2_ * sVar41 + sVar51 + in_XMM9._6_2_;
                auVar103._8_2_ = auVar91._4_2_ * sVar42 + sVar52 + in_XMM9._8_2_;
                auVar103._10_2_ = auVar91._6_2_ * sVar43 + sVar53 + in_XMM9._10_2_;
                auVar103._12_2_ = auVar91._4_2_ * sVar44 + sVar54 + in_XMM9._12_2_;
                auVar103._14_2_ = auVar91._6_2_ * sVar45 + sVar55 + in_XMM9._14_2_;
                auVar104 = pmulhuw(auVar103,auVar15);
                auVar107._0_2_ = uVar75 * sVar37 + sVar47 + in_XMM6._0_2_;
                auVar107._2_2_ = uVar75 * sVar39 + sVar49 + in_XMM6._2_2_;
                auVar107._4_2_ = uVar75 * sVar40 + sVar50 + in_XMM6._4_2_;
                auVar107._6_2_ = uVar75 * sVar41 + sVar51 + in_XMM6._6_2_;
                auVar107._8_2_ = uVar78 * sVar42 + sVar52 + in_XMM6._8_2_;
                auVar107._10_2_ = uVar78 * sVar43 + sVar53 + in_XMM6._10_2_;
                auVar107._12_2_ = uVar78 * sVar44 + sVar54 + in_XMM6._12_2_;
                auVar107._14_2_ = uVar78 * sVar45 + sVar55 + in_XMM6._14_2_;
                in_XMM15 = pmulhuw(auVar107,auVar15);
                sVar98 = auVar104._0_2_;
                sVar57 = auVar104._2_2_;
                in_XMM14[1] = (0 < sVar57) * (sVar57 < 0x100) * auVar104[2] - (0xff < sVar57);
                in_XMM14[0] = (0 < sVar98) * (sVar98 < 0x100) * auVar104[0] - (0xff < sVar98);
                sVar98 = auVar104._4_2_;
                in_XMM14[2] = (0 < sVar98) * (sVar98 < 0x100) * auVar104[4] - (0xff < sVar98);
                sVar98 = auVar104._6_2_;
                in_XMM14[3] = (0 < sVar98) * (sVar98 < 0x100) * auVar104[6] - (0xff < sVar98);
                sVar98 = auVar104._8_2_;
                in_XMM14[4] = (0 < sVar98) * (sVar98 < 0x100) * auVar104[8] - (0xff < sVar98);
                sVar98 = auVar104._10_2_;
                in_XMM14[5] = (0 < sVar98) * (sVar98 < 0x100) * auVar104[10] - (0xff < sVar98);
                sVar98 = auVar104._12_2_;
                in_XMM14[6] = (0 < sVar98) * (sVar98 < 0x100) * auVar104[0xc] - (0xff < sVar98);
                sVar98 = auVar104._14_2_;
                in_XMM14[7] = (0 < sVar98) * (sVar98 < 0x100) * auVar104[0xe] - (0xff < sVar98);
                sVar98 = in_XMM15._0_2_;
                in_XMM14[8] = (0 < sVar98) * (sVar98 < 0x100) * in_XMM15[0] - (0xff < sVar98);
                sVar98 = in_XMM15._2_2_;
                in_XMM14[9] = (0 < sVar98) * (sVar98 < 0x100) * in_XMM15[2] - (0xff < sVar98);
                sVar98 = in_XMM15._4_2_;
                in_XMM14[10] = (0 < sVar98) * (sVar98 < 0x100) * in_XMM15[4] - (0xff < sVar98);
                sVar98 = in_XMM15._6_2_;
                in_XMM14[0xb] = (0 < sVar98) * (sVar98 < 0x100) * in_XMM15[6] - (0xff < sVar98);
                sVar98 = in_XMM15._8_2_;
                in_XMM14[0xc] = (0 < sVar98) * (sVar98 < 0x100) * in_XMM15[8] - (0xff < sVar98);
                sVar98 = in_XMM15._10_2_;
                in_XMM14[0xd] = (0 < sVar98) * (sVar98 < 0x100) * in_XMM15[10] - (0xff < sVar98);
                sVar98 = in_XMM15._12_2_;
                in_XMM14[0xe] = (0 < sVar98) * (sVar98 < 0x100) * in_XMM15[0xc] - (0xff < sVar98);
                sVar98 = in_XMM15._14_2_;
                in_XMM14[0xf] = (0 < sVar98) * (sVar98 < 0x100) * in_XMM15[0xe] - (0xff < sVar98);
                *(undefined1 (*) [16])(lVar30 + uVar24 * 4) = in_XMM14;
                uVar24 = uVar24 + 4;
                uVar20 = uVar20 - 1;
              } while (uVar20 != 0);
            }
            if (uVar24 < uVar17) {
              in_XMM13 = pmovzxbw(in_XMM13,0x8080808080808080);
              in_XMM14 = pmovzxbw(in_XMM14,0xffffffffffffffff);
              auVar104 = auVar96;
              do {
                auVar96._0_4_ = auVar104._0_4_ + *(int *)(lVar25 + uVar24 * 8);
                auVar96._4_4_ = auVar104._4_4_;
                auVar96._8_4_ = auVar104._8_4_;
                auVar96._12_4_ = auVar104._12_4_;
                *(undefined8 *)(lVar25 + uVar24 * 8) = 0;
                auVar93._0_4_ = auVar96._0_4_ - (*(uint *)(lVar25 + 4 + uVar24 * 8) >> 9);
                auVar93._4_4_ = auVar96._4_4_;
                auVar93._8_4_ = auVar96._8_4_;
                auVar93._12_4_ = auVar96._12_4_;
                auVar104 = packusdw(auVar93 & auVar90,auVar93 & auVar90);
                iVar22 = auVar90._0_4_ - auVar104._0_4_;
                iVar26 = auVar90._4_4_ - auVar104._4_4_;
                iVar82 = auVar90._8_4_ - auVar104._8_4_;
                iVar87 = auVar90._12_4_ - auVar104._12_4_;
                sVar98 = auVar104._0_2_;
                sVar57 = (short)iVar22;
                auVar67._0_2_ =
                     (ushort)(sVar98 < sVar57) * sVar98 | (ushort)(sVar98 >= sVar57) * sVar57;
                sVar98 = auVar104._2_2_;
                sVar57 = (short)((uint)iVar22 >> 0x10);
                auVar67._2_2_ =
                     (ushort)(sVar98 < sVar57) * sVar98 | (ushort)(sVar98 >= sVar57) * sVar57;
                sVar98 = auVar104._4_2_;
                sVar57 = (short)iVar26;
                auVar67._4_2_ =
                     (ushort)(sVar98 < sVar57) * sVar98 | (ushort)(sVar98 >= sVar57) * sVar57;
                sVar98 = auVar104._6_2_;
                sVar57 = (short)((uint)iVar26 >> 0x10);
                auVar67._6_2_ =
                     (ushort)(sVar98 < sVar57) * sVar98 | (ushort)(sVar98 >= sVar57) * sVar57;
                sVar98 = auVar104._8_2_;
                sVar57 = (short)iVar82;
                auVar67._8_2_ =
                     (ushort)(sVar98 < sVar57) * sVar98 | (ushort)(sVar98 >= sVar57) * sVar57;
                sVar98 = auVar104._10_2_;
                sVar57 = (short)((uint)iVar82 >> 0x10);
                auVar67._10_2_ =
                     (ushort)(sVar98 < sVar57) * sVar98 | (ushort)(sVar98 >= sVar57) * sVar57;
                sVar98 = auVar104._12_2_;
                sVar57 = (short)iVar87;
                sVar59 = (short)((uint)iVar87 >> 0x10);
                auVar67._12_2_ =
                     (ushort)(sVar98 < sVar57) * sVar98 | (ushort)(sVar98 >= sVar57) * sVar57;
                sVar98 = auVar104._14_2_;
                auVar67._14_2_ =
                     (ushort)(sVar98 < sVar59) * sVar98 | (ushort)(sVar98 >= sVar59) * sVar59;
                auVar91 = ZEXT416(*(uint *)(lVar30 + uVar24 * 4));
                auVar104 = pshuflw(auVar67,auVar67,0);
                in_XMM9 = pmovzxbw(auVar91,auVar91);
                auVar91 = auVar104 ^ in_XMM14;
                auVar68._0_2_ =
                     auVar91._0_2_ * in_XMM9._0_2_ + auVar104._0_2_ * sVar37 + in_XMM13._0_2_;
                auVar68._2_2_ =
                     auVar91._2_2_ * in_XMM9._2_2_ + auVar104._2_2_ * sVar39 + in_XMM13._2_2_;
                auVar68._4_2_ =
                     auVar91._4_2_ * in_XMM9._4_2_ + auVar104._4_2_ * sVar40 + in_XMM13._4_2_;
                auVar68._6_2_ =
                     auVar91._6_2_ * in_XMM9._6_2_ + auVar104._6_2_ * sVar41 + in_XMM13._6_2_;
                auVar68._8_2_ =
                     auVar91._8_2_ * in_XMM9._8_2_ + auVar104._8_2_ * sVar42 + in_XMM13._8_2_;
                auVar68._10_2_ =
                     auVar91._10_2_ * in_XMM9._10_2_ + auVar104._10_2_ * sVar43 + in_XMM13._10_2_;
                auVar68._12_2_ =
                     auVar91._12_2_ * in_XMM9._12_2_ + auVar104._12_2_ * sVar44 + in_XMM13._12_2_;
                auVar68._14_2_ =
                     auVar91._14_2_ * in_XMM9._14_2_ + auVar104._14_2_ * sVar45 + in_XMM13._14_2_;
                auVar104 = pmulhuw(auVar68,auVar16);
                sVar98 = auVar104._0_2_;
                sVar57 = auVar104._2_2_;
                sVar59 = auVar104._4_2_;
                sVar56 = auVar104._6_2_;
                in_XMM6._0_4_ =
                     CONCAT13((0 < sVar56) * (sVar56 < 0x100) * auVar104[6] - (0xff < sVar56),
                              CONCAT12((0 < sVar59) * (sVar59 < 0x100) * auVar104[4] -
                                       (0xff < sVar59),
                                       CONCAT11((0 < sVar57) * (sVar57 < 0x100) * auVar104[2] -
                                                (0xff < sVar57),
                                                (0 < sVar98) * (sVar98 < 0x100) * auVar104[0] -
                                                (0xff < sVar98))));
                sVar73 = auVar104._8_2_;
                in_XMM6[4] = (0 < sVar73) * (sVar73 < 0x100) * auVar104[8] - (0xff < sVar73);
                sVar76 = auVar104._10_2_;
                in_XMM6[5] = (0 < sVar76) * (sVar76 < 0x100) * auVar104[10] - (0xff < sVar76);
                sVar81 = auVar104._12_2_;
                in_XMM6[6] = (0 < sVar81) * (sVar81 < 0x100) * auVar104[0xc] - (0xff < sVar81);
                sVar84 = auVar104._14_2_;
                in_XMM6[7] = (0 < sVar84) * (sVar84 < 0x100) * auVar104[0xe] - (0xff < sVar84);
                in_XMM6[8] = (0 < sVar98) * (sVar98 < 0x100) * auVar104[0] - (0xff < sVar98);
                in_XMM6[9] = (0 < sVar57) * (sVar57 < 0x100) * auVar104[2] - (0xff < sVar57);
                in_XMM6[10] = (0 < sVar59) * (sVar59 < 0x100) * auVar104[4] - (0xff < sVar59);
                in_XMM6[0xb] = (0 < sVar56) * (sVar56 < 0x100) * auVar104[6] - (0xff < sVar56);
                in_XMM6[0xc] = (0 < sVar73) * (sVar73 < 0x100) * auVar104[8] - (0xff < sVar73);
                in_XMM6[0xd] = (0 < sVar76) * (sVar76 < 0x100) * auVar104[10] - (0xff < sVar76);
                in_XMM6[0xe] = (0 < sVar81) * (sVar81 < 0x100) * auVar104[0xc] - (0xff < sVar81);
                in_XMM6[0xf] = (0 < sVar84) * (sVar84 < 0x100) * auVar104[0xe] - (0xff < sVar84);
                *(undefined4 *)(lVar30 + uVar24 * 4) = in_XMM6._0_4_;
                uVar24 = uVar24 + 1;
                auVar104 = auVar96;
              } while (uVar17 != uVar24);
            }
            uVar28 = auVar96._0_4_;
            uVar20 = uVar23;
          } while (uVar23 != 0);
        }
        uVar31 = uVar31 + 0x800;
        puVar35 = puVar35 + 1;
        lVar21 = lVar21 + -1;
      } while (lVar21 != 0);
      uVar31 = (ulong)*(int *)(this + 0x30);
      uVar20 = uVar31 - uVar17;
      if (uVar17 <= uVar31 && uVar20 != 0) {
        uVar28 = uVar28 & 0x1ff;
        uVar34 = uVar28 ^ 0x1ff;
        if (uVar28 < 0x100) {
          uVar34 = uVar28;
        }
        if (uVar34 != 0) {
          uVar24 = uVar20 >> 2;
          if (uVar34 == 0xff) {
            if (0x1f < uVar20) {
              do {
                *(undefined1 (*) [16])(lVar30 + uVar17 * 4) = auVar36;
                *(undefined1 (*) [16])(lVar30 + 0x10 + uVar17 * 4) = auVar36;
                *(undefined1 (*) [16])(lVar30 + 0x20 + uVar17 * 4) = auVar36;
                *(undefined1 (*) [16])(lVar30 + 0x30 + uVar17 * 4) = auVar36;
                *(undefined1 (*) [16])(lVar30 + 0x40 + uVar17 * 4) = auVar36;
                *(undefined1 (*) [16])(lVar30 + 0x50 + uVar17 * 4) = auVar36;
                *(undefined1 (*) [16])(lVar30 + 0x60 + uVar17 * 4) = auVar36;
                *(undefined1 (*) [16])(lVar30 + 0x70 + uVar17 * 4) = auVar36;
                uVar17 = uVar17 + 0x20;
                uVar24 = uVar24 - 8;
              } while (7 < uVar24);
            }
            for (; uVar24 != 0; uVar24 = uVar24 - 1) {
              *(undefined1 (*) [16])(lVar30 + uVar17 * 4) = auVar36;
              uVar17 = uVar17 + 4;
            }
            if (uVar17 < uVar31) {
              do {
                *(uint *)(lVar30 + uVar17 * 4) = uVar29;
                uVar17 = uVar17 + 1;
              } while (uVar31 != uVar17);
            }
          }
          else {
            auVar104 = pshuflw(ZEXT416(uVar34),ZEXT416(uVar34),0);
            uVar60 = auVar104._0_4_;
            auVar97._4_4_ = uVar60;
            auVar97._0_4_ = uVar60;
            auVar97._8_4_ = uVar60;
            auVar97._12_4_ = uVar60;
            sVar98 = auVar104._0_2_;
            sVar57 = auVar104._2_2_;
            auVar97 = auVar97 ^ auVar46;
            in_XMM13._0_2_ = sVar98 * sVar37 + sVar47;
            in_XMM13._2_2_ = sVar57 * sVar39 + sVar49;
            in_XMM13._4_2_ = sVar98 * sVar40 + sVar50;
            in_XMM13._6_2_ = sVar57 * sVar41 + sVar51;
            in_XMM13._8_2_ = sVar98 * sVar42 + sVar52;
            in_XMM13._10_2_ = sVar57 * sVar43 + sVar53;
            in_XMM13._12_2_ = sVar98 * sVar44 + sVar54;
            in_XMM13._14_2_ = sVar57 * sVar45 + sVar55;
            sVar47 = auVar97._0_2_;
            sVar49 = auVar97._2_2_;
            sVar50 = auVar97._4_2_;
            sVar51 = auVar97._6_2_;
            sVar52 = auVar97._8_2_;
            sVar53 = auVar97._10_2_;
            sVar54 = auVar97._12_2_;
            sVar55 = auVar97._14_2_;
            if (7 < uVar20) {
              do {
                auVar104 = *(undefined1 (*) [16])(lVar30 + uVar17 * 4);
                auVar91 = *(undefined1 (*) [16])(lVar30 + 0x10 + uVar17 * 4);
                auVar110 = pmovzxbw(in_XMM15,auVar104);
                auVar100 = pmovzxbw(in_XMM9,auVar91);
                auVar70._0_2_ = (ushort)auVar104[8] * sVar47 + in_XMM13._0_2_;
                auVar70._2_2_ = (ushort)auVar104[9] * sVar49 + in_XMM13._2_2_;
                auVar70._4_2_ = (ushort)auVar104[10] * sVar50 + in_XMM13._4_2_;
                auVar70._6_2_ = (ushort)auVar104[0xb] * sVar51 + in_XMM13._6_2_;
                auVar70._8_2_ = (ushort)auVar104[0xc] * sVar52 + in_XMM13._8_2_;
                auVar70._10_2_ = (ushort)auVar104[0xd] * sVar53 + in_XMM13._10_2_;
                auVar70._12_2_ = (ushort)auVar104[0xe] * sVar54 + in_XMM13._12_2_;
                auVar70._14_2_ = (ushort)auVar104[0xf] * sVar55 + in_XMM13._14_2_;
                auVar104 = pmulhuw(auVar70,auVar15);
                auVar106._0_2_ = (ushort)auVar91[8] * sVar47 + in_XMM13._0_2_;
                auVar106._2_2_ = (ushort)auVar91[9] * sVar49 + in_XMM13._2_2_;
                auVar106._4_2_ = (ushort)auVar91[10] * sVar50 + in_XMM13._4_2_;
                auVar106._6_2_ = (ushort)auVar91[0xb] * sVar51 + in_XMM13._6_2_;
                auVar106._8_2_ = (ushort)auVar91[0xc] * sVar52 + in_XMM13._8_2_;
                auVar106._10_2_ = (ushort)auVar91[0xd] * sVar53 + in_XMM13._10_2_;
                auVar106._12_2_ = (ushort)auVar91[0xe] * sVar54 + in_XMM13._12_2_;
                auVar106._14_2_ = (ushort)auVar91[0xf] * sVar55 + in_XMM13._14_2_;
                in_XMM14 = pmulhuw(auVar106,auVar15);
                auVar111._0_2_ = auVar110._0_2_ * sVar47 + in_XMM13._0_2_;
                auVar111._2_2_ = auVar110._2_2_ * sVar49 + in_XMM13._2_2_;
                auVar111._4_2_ = auVar110._4_2_ * sVar50 + in_XMM13._4_2_;
                auVar111._6_2_ = auVar110._6_2_ * sVar51 + in_XMM13._6_2_;
                auVar111._8_2_ = auVar110._8_2_ * sVar52 + in_XMM13._8_2_;
                auVar111._10_2_ = auVar110._10_2_ * sVar53 + in_XMM13._10_2_;
                auVar111._12_2_ = auVar110._12_2_ * sVar54 + in_XMM13._12_2_;
                auVar111._14_2_ = auVar110._14_2_ * sVar55 + in_XMM13._14_2_;
                auVar91 = pmulhuw(auVar111,auVar15);
                sVar59 = auVar91._0_2_;
                sVar56 = auVar91._2_2_;
                in_XMM15[1] = (0 < sVar56) * (sVar56 < 0x100) * auVar91[2] - (0xff < sVar56);
                in_XMM15[0] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[0] - (0xff < sVar59);
                sVar59 = auVar91._4_2_;
                in_XMM15[2] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[4] - (0xff < sVar59);
                sVar59 = auVar91._6_2_;
                in_XMM15[3] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[6] - (0xff < sVar59);
                sVar59 = auVar91._8_2_;
                in_XMM15[4] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[8] - (0xff < sVar59);
                sVar59 = auVar91._10_2_;
                in_XMM15[5] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[10] - (0xff < sVar59);
                sVar59 = auVar91._12_2_;
                in_XMM15[6] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[0xc] - (0xff < sVar59);
                sVar59 = auVar91._14_2_;
                in_XMM15[7] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[0xe] - (0xff < sVar59);
                sVar59 = auVar104._0_2_;
                in_XMM15[8] = (0 < sVar59) * (sVar59 < 0x100) * auVar104[0] - (0xff < sVar59);
                sVar59 = auVar104._2_2_;
                in_XMM15[9] = (0 < sVar59) * (sVar59 < 0x100) * auVar104[2] - (0xff < sVar59);
                sVar59 = auVar104._4_2_;
                in_XMM15[10] = (0 < sVar59) * (sVar59 < 0x100) * auVar104[4] - (0xff < sVar59);
                sVar59 = auVar104._6_2_;
                in_XMM15[0xb] = (0 < sVar59) * (sVar59 < 0x100) * auVar104[6] - (0xff < sVar59);
                sVar59 = auVar104._8_2_;
                in_XMM15[0xc] = (0 < sVar59) * (sVar59 < 0x100) * auVar104[8] - (0xff < sVar59);
                sVar59 = auVar104._10_2_;
                in_XMM15[0xd] = (0 < sVar59) * (sVar59 < 0x100) * auVar104[10] - (0xff < sVar59);
                sVar59 = auVar104._12_2_;
                in_XMM15[0xe] = (0 < sVar59) * (sVar59 < 0x100) * auVar104[0xc] - (0xff < sVar59);
                sVar59 = auVar104._14_2_;
                in_XMM15[0xf] = (0 < sVar59) * (sVar59 < 0x100) * auVar104[0xe] - (0xff < sVar59);
                auVar94._0_2_ = auVar100._0_2_ * sVar47 + in_XMM13._0_2_;
                auVar94._2_2_ = auVar100._2_2_ * sVar49 + in_XMM13._2_2_;
                auVar94._4_2_ = auVar100._4_2_ * sVar50 + in_XMM13._4_2_;
                auVar94._6_2_ = auVar100._6_2_ * sVar51 + in_XMM13._6_2_;
                auVar94._8_2_ = auVar100._8_2_ * sVar52 + in_XMM13._8_2_;
                auVar94._10_2_ = auVar100._10_2_ * sVar53 + in_XMM13._10_2_;
                auVar94._12_2_ = auVar100._12_2_ * sVar54 + in_XMM13._12_2_;
                auVar94._14_2_ = auVar100._14_2_ * sVar55 + in_XMM13._14_2_;
                auVar91 = pmulhuw(auVar94,auVar15);
                sVar59 = auVar91._0_2_;
                sVar56 = auVar91._2_2_;
                in_XMM9[1] = (0 < sVar56) * (sVar56 < 0x100) * auVar91[2] - (0xff < sVar56);
                in_XMM9[0] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[0] - (0xff < sVar59);
                sVar59 = auVar91._4_2_;
                in_XMM9[2] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[4] - (0xff < sVar59);
                sVar59 = auVar91._6_2_;
                in_XMM9[3] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[6] - (0xff < sVar59);
                sVar59 = auVar91._8_2_;
                in_XMM9[4] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[8] - (0xff < sVar59);
                sVar59 = auVar91._10_2_;
                in_XMM9[5] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[10] - (0xff < sVar59);
                sVar59 = auVar91._12_2_;
                in_XMM9[6] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[0xc] - (0xff < sVar59);
                sVar59 = auVar91._14_2_;
                in_XMM9[7] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[0xe] - (0xff < sVar59);
                sVar59 = in_XMM14._0_2_;
                in_XMM9[8] = (0 < sVar59) * (sVar59 < 0x100) * in_XMM14[0] - (0xff < sVar59);
                sVar59 = in_XMM14._2_2_;
                in_XMM9[9] = (0 < sVar59) * (sVar59 < 0x100) * in_XMM14[2] - (0xff < sVar59);
                sVar59 = in_XMM14._4_2_;
                in_XMM9[10] = (0 < sVar59) * (sVar59 < 0x100) * in_XMM14[4] - (0xff < sVar59);
                sVar59 = in_XMM14._6_2_;
                in_XMM9[0xb] = (0 < sVar59) * (sVar59 < 0x100) * in_XMM14[6] - (0xff < sVar59);
                sVar59 = in_XMM14._8_2_;
                in_XMM9[0xc] = (0 < sVar59) * (sVar59 < 0x100) * in_XMM14[8] - (0xff < sVar59);
                sVar59 = in_XMM14._10_2_;
                in_XMM9[0xd] = (0 < sVar59) * (sVar59 < 0x100) * in_XMM14[10] - (0xff < sVar59);
                sVar59 = in_XMM14._12_2_;
                in_XMM9[0xe] = (0 < sVar59) * (sVar59 < 0x100) * in_XMM14[0xc] - (0xff < sVar59);
                sVar59 = in_XMM14._14_2_;
                in_XMM9[0xf] = (0 < sVar59) * (sVar59 < 0x100) * in_XMM14[0xe] - (0xff < sVar59);
                *(undefined1 (*) [16])(lVar30 + uVar17 * 4) = in_XMM15;
                *(undefined1 (*) [16])(lVar30 + 0x10 + uVar17 * 4) = in_XMM9;
                uVar17 = uVar17 + 8;
                uVar24 = uVar24 - 2;
              } while (1 < uVar24);
            }
            if (uVar24 != 0) {
              auVar104 = *(undefined1 (*) [16])(lVar30 + uVar17 * 4);
              auVar91 = pmovzxbw(in_XMM9,auVar104);
              auVar71._0_2_ = (ushort)auVar104[8] * sVar47 + in_XMM13._0_2_;
              auVar71._2_2_ = (ushort)auVar104[9] * sVar49 + in_XMM13._2_2_;
              auVar71._4_2_ = (ushort)auVar104[10] * sVar50 + in_XMM13._4_2_;
              auVar71._6_2_ = (ushort)auVar104[0xb] * sVar51 + in_XMM13._6_2_;
              auVar71._8_2_ = (ushort)auVar104[0xc] * sVar52 + in_XMM13._8_2_;
              auVar71._10_2_ = (ushort)auVar104[0xd] * sVar53 + in_XMM13._10_2_;
              auVar71._12_2_ = (ushort)auVar104[0xe] * sVar54 + in_XMM13._12_2_;
              auVar71._14_2_ = (ushort)auVar104[0xf] * sVar55 + in_XMM13._14_2_;
              auVar104 = pmulhuw(auVar71,auVar15);
              auVar95._0_2_ = auVar91._0_2_ * sVar47 + in_XMM13._0_2_;
              auVar95._2_2_ = auVar91._2_2_ * sVar49 + in_XMM13._2_2_;
              auVar95._4_2_ = auVar91._4_2_ * sVar50 + in_XMM13._4_2_;
              auVar95._6_2_ = auVar91._6_2_ * sVar51 + in_XMM13._6_2_;
              auVar95._8_2_ = auVar91._8_2_ * sVar52 + in_XMM13._8_2_;
              auVar95._10_2_ = auVar91._10_2_ * sVar53 + in_XMM13._10_2_;
              auVar95._12_2_ = auVar91._12_2_ * sVar54 + in_XMM13._12_2_;
              auVar95._14_2_ = auVar91._14_2_ * sVar55 + in_XMM13._14_2_;
              auVar91 = pmulhuw(auVar95,auVar15);
              sVar59 = auVar91._0_2_;
              sVar56 = auVar91._2_2_;
              in_XMM9[1] = (0 < sVar56) * (sVar56 < 0x100) * auVar91[2] - (0xff < sVar56);
              in_XMM9[0] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[0] - (0xff < sVar59);
              sVar59 = auVar91._4_2_;
              in_XMM9[2] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[4] - (0xff < sVar59);
              sVar59 = auVar91._6_2_;
              in_XMM9[3] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[6] - (0xff < sVar59);
              sVar59 = auVar91._8_2_;
              in_XMM9[4] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[8] - (0xff < sVar59);
              sVar59 = auVar91._10_2_;
              in_XMM9[5] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[10] - (0xff < sVar59);
              sVar59 = auVar91._12_2_;
              in_XMM9[6] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[0xc] - (0xff < sVar59);
              sVar59 = auVar91._14_2_;
              in_XMM9[7] = (0 < sVar59) * (sVar59 < 0x100) * auVar91[0xe] - (0xff < sVar59);
              sVar59 = auVar104._0_2_;
              in_XMM9[8] = (0 < sVar59) * (sVar59 < 0x100) * auVar104[0] - (0xff < sVar59);
              sVar59 = auVar104._2_2_;
              in_XMM9[9] = (0 < sVar59) * (sVar59 < 0x100) * auVar104[2] - (0xff < sVar59);
              sVar59 = auVar104._4_2_;
              in_XMM9[10] = (0 < sVar59) * (sVar59 < 0x100) * auVar104[4] - (0xff < sVar59);
              sVar59 = auVar104._6_2_;
              in_XMM9[0xb] = (0 < sVar59) * (sVar59 < 0x100) * auVar104[6] - (0xff < sVar59);
              sVar59 = auVar104._8_2_;
              in_XMM9[0xc] = (0 < sVar59) * (sVar59 < 0x100) * auVar104[8] - (0xff < sVar59);
              sVar59 = auVar104._10_2_;
              in_XMM9[0xd] = (0 < sVar59) * (sVar59 < 0x100) * auVar104[10] - (0xff < sVar59);
              sVar59 = auVar104._12_2_;
              in_XMM9[0xe] = (0 < sVar59) * (sVar59 < 0x100) * auVar104[0xc] - (0xff < sVar59);
              sVar59 = auVar104._14_2_;
              in_XMM9[0xf] = (0 < sVar59) * (sVar59 < 0x100) * auVar104[0xe] - (0xff < sVar59);
              *(undefined1 (*) [16])(lVar30 + uVar17 * 4) = in_XMM9;
              uVar17 = uVar17 + 4;
            }
            in_XMM6 = pmovzxbw(auVar104,0x8080808080808080);
            if (uVar17 < uVar31) {
              sVar59 = in_XMM6._0_2_;
              sVar56 = in_XMM6._2_2_;
              sVar73 = in_XMM6._4_2_;
              sVar76 = in_XMM6._6_2_;
              sVar81 = in_XMM6._8_2_;
              sVar84 = in_XMM6._10_2_;
              sVar86 = in_XMM6._12_2_;
              sVar89 = in_XMM6._14_2_;
              do {
                auVar104 = ZEXT416(*(uint *)(lVar30 + uVar17 * 4));
                auVar104 = pmovzxbw(auVar104,auVar104);
                auVar72._0_2_ = auVar104._0_2_ * sVar47 + sVar98 * sVar37 + sVar59;
                auVar72._2_2_ = auVar104._2_2_ * sVar49 + sVar57 * sVar39 + sVar56;
                auVar72._4_2_ = auVar104._4_2_ * sVar50 + sVar98 * sVar40 + sVar73;
                auVar72._6_2_ = auVar104._6_2_ * sVar51 + sVar57 * sVar41 + sVar76;
                auVar72._8_2_ = auVar104._8_2_ * sVar52 + sVar98 * sVar42 + sVar81;
                auVar72._10_2_ = auVar104._10_2_ * sVar53 + sVar57 * sVar43 + sVar84;
                auVar72._12_2_ = auVar104._12_2_ * sVar54 + sVar98 * sVar44 + sVar86;
                auVar72._14_2_ = auVar104._14_2_ * sVar55 + sVar57 * sVar45 + sVar89;
                auVar104 = pmulhuw(auVar72,auVar16);
                sVar58 = auVar104._0_2_;
                sVar74 = auVar104._2_2_;
                sVar77 = auVar104._4_2_;
                sVar79 = auVar104._6_2_;
                in_XMM6._0_4_ =
                     CONCAT13((0 < sVar79) * (sVar79 < 0x100) * auVar104[6] - (0xff < sVar79),
                              CONCAT12((0 < sVar77) * (sVar77 < 0x100) * auVar104[4] -
                                       (0xff < sVar77),
                                       CONCAT11((0 < sVar74) * (sVar74 < 0x100) * auVar104[2] -
                                                (0xff < sVar74),
                                                (0 < sVar58) * (sVar58 < 0x100) * auVar104[0] -
                                                (0xff < sVar58))));
                sVar80 = auVar104._8_2_;
                in_XMM6[4] = (0 < sVar80) * (sVar80 < 0x100) * auVar104[8] - (0xff < sVar80);
                sVar83 = auVar104._10_2_;
                in_XMM6[5] = (0 < sVar83) * (sVar83 < 0x100) * auVar104[10] - (0xff < sVar83);
                sVar85 = auVar104._12_2_;
                in_XMM6[6] = (0 < sVar85) * (sVar85 < 0x100) * auVar104[0xc] - (0xff < sVar85);
                sVar88 = auVar104._14_2_;
                in_XMM6[7] = (0 < sVar88) * (sVar88 < 0x100) * auVar104[0xe] - (0xff < sVar88);
                in_XMM6[8] = (0 < sVar58) * (sVar58 < 0x100) * auVar104[0] - (0xff < sVar58);
                in_XMM6[9] = (0 < sVar74) * (sVar74 < 0x100) * auVar104[2] - (0xff < sVar74);
                in_XMM6[10] = (0 < sVar77) * (sVar77 < 0x100) * auVar104[4] - (0xff < sVar77);
                in_XMM6[0xb] = (0 < sVar79) * (sVar79 < 0x100) * auVar104[6] - (0xff < sVar79);
                in_XMM6[0xc] = (0 < sVar80) * (sVar80 < 0x100) * auVar104[8] - (0xff < sVar80);
                in_XMM6[0xd] = (0 < sVar83) * (sVar83 < 0x100) * auVar104[10] - (0xff < sVar83);
                in_XMM6[0xe] = (0 < sVar85) * (sVar85 < 0x100) * auVar104[0xc] - (0xff < sVar85);
                in_XMM6[0xf] = (0 < sVar88) * (sVar88 < 0x100) * auVar104[0xe] - (0xff < sVar88);
                *(undefined4 *)(lVar30 + uVar17 * 4) = in_XMM6._0_4_;
                uVar17 = uVar17 + 1;
              } while (uVar31 != uVar17);
            }
          }
        }
      }
      lVar30 = lVar30 + lVar4;
      lVar25 = lVar25 + *(long *)(this + 0x58) * 8;
      uVar32 = uVar32 + 1;
    } while (uVar32 <= (ulong)(long)(int)uVar3);
  }
  *(undefined8 *)(this + 0x40) = 0x7fffffff;
  return;
}

Assistant:

inline void RasterizerA3<N>::_renderImpl(uint32_t argb32) noexcept {
  uint8_t* dstLine = _dst->data();
  intptr_t dstStride = _dst->stride();

  size_t y0 = size_t(_yBounds.start);
  size_t y1 = size_t(_yBounds.end);

  BitWord* bitPtr = _bits + y0 * _bitStride;
  Cell* cellLine = _cells + y0 * _cellStride;

  Compositor compositor(argb32);
  dstLine += y0 * dstStride;

  while (y0 <= y1) {
    size_t nBits = size_t(_bitStride);

    Cell* cell = cellLine;
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);

    int cover = 0;
    size_t x0 = 0;
    size_t xOffset = 0;

    do {
      IntUtils::BitWordFlipIterator<BitWord> it(*bitPtr);
      *bitPtr = 0;

      while (it.hasNext()) {
        size_t x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        if (x0 < x1) {
          uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
          if (mask)
            compositor.cmask(dstPix, x0, x1, mask);
          x0 = x1;
        }

        if (it.hasNext())
          x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        else
          x1 = std::min<size_t>(_width, xOffset + kPixelsPerBitWord);

        compositor.template vmask<NonZero>(dstPix, x0, x1, cell, cover);
        x0 = x1;
      }

      xOffset += kPixelsPerBitWord;
      bitPtr++;
    } while (--nBits);

    if (x0 < _width) {
      uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
      if (mask)
        compositor.cmask(dstPix, x0, _width, mask);
    }

    dstLine += dstStride;
    cellLine += _cellStride;
    y0++;
  }

  _yBounds.reset();
}